

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pTextureFilteringTests.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Performance::TextureFilteringTests::init(TextureFilteringTests *this,EVP_PKEY_CTX *ctx)

{
  uint minFilter;
  deUint32 format;
  deUint32 dataType;
  char *__s;
  Texture2DRenderCase *this_00;
  long lVar1;
  deUint32 magFilter;
  char *__rhs;
  Mat3 *coordTransform;
  long lVar2;
  bool bVar3;
  Vector<float,_2> local_f0;
  string name;
  Matrix<float,_3,_3> local_c0;
  undefined1 local_98 [32];
  Mat3 magTransform;
  Mat3 minTransform;
  
  local_98._0_4_ = -0.3;
  local_98._4_4_ = -0.6;
  tcu::translationMatrix<float,_2>(&magTransform,(Vector<float,_2> *)local_98);
  local_c0.m_data.m_data[0].m_data._0_8_ = (pointer)0x401333333fd9999a;
  local_c0.m_data.m_data[0].m_data[2] = 1.0;
  tcu::Matrix<float,_3,_3>::Matrix((Matrix<float,_3,_3> *)&name,(Vector<float,_3> *)&local_c0);
  tcu::operator*(&minTransform,&magTransform,(Matrix<float,_3,_3> *)&name);
  local_f0.m_data[0] = 0.3;
  local_f0.m_data[1] = 0.4;
  tcu::translationMatrix<float,_2>((Matrix<float,_3,_3> *)&name,&local_f0);
  local_98._0_4_ = 0.3;
  local_98._4_4_ = 0.2;
  local_98._8_4_ = 1.0;
  tcu::Matrix<float,_3,_3>::Matrix(&local_c0,(Vector<float,_3> *)local_98);
  tcu::operator*(&magTransform,(Matrix<float,_3,_3> *)&name,&local_c0);
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    minFilter = init::cases[lVar1].filter;
    magFilter = 0x2601;
    if ((minFilter & 0xfffffffe) == 0x2600) {
      magFilter = minFilter;
    }
    bVar3 = init::cases[lVar1].minify != false;
    __s = init::cases[lVar1].name;
    __rhs = "_magnify_";
    if (bVar3) {
      __rhs = "_minify_";
    }
    coordTransform = &magTransform;
    if (bVar3) {
      coordTransform = &minTransform;
    }
    for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 0x10) {
      format = *(deUint32 *)((long)&init::texFormats[0].format + lVar2);
      dataType = *(deUint32 *)((long)&init::texFormats[0].dataType + lVar2);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_98,__s,(allocator<char> *)&local_f0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                     __rhs);
      std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_c0,*(char **)((long)&init::texFormats[0].name + lVar2));
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)local_98);
      this_00 = (Texture2DRenderCase *)operator_new(0x220);
      Texture2DRenderCase::Texture2DRenderCase
                (this_00,(this->super_TestCaseGroup).m_context,name._M_dataplus._M_p,
                 glcts::fixed_sample_locations_values + 1,format,dataType,0x2901,0x2901,minFilter,
                 magFilter,coordTransform,1,true);
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
      std::__cxx11::string::~string((string *)&name);
    }
  }
  return 8;
}

Assistant:

void TextureFilteringTests::init (void)
{
	static const struct
	{
		const char*	name;
		deUint32	format;
		deUint32	dataType;
	} texFormats[] =
	{
		{ "rgb565",		GL_RGB,				GL_UNSIGNED_SHORT_5_6_5 },
		{ "rgba8888",	GL_RGBA,			GL_UNSIGNED_BYTE }
	};
	static const struct
	{
		const char*	name;
		deUint32	filter;
		bool		minify;
	} cases[] =
	{
		{ "nearest",				GL_NEAREST,					true	},
		{ "nearest",				GL_NEAREST,					false	},
		{ "linear",					GL_LINEAR,					true	},
		{ "linear",					GL_LINEAR,					false	},
		{ "nearest_mipmap_nearest",	GL_NEAREST_MIPMAP_NEAREST,	true	},
		{ "nearest_mipmap_linear",	GL_NEAREST_MIPMAP_LINEAR,	true	},
		{ "linear_mipmap_nearest",	GL_LINEAR_MIPMAP_NEAREST,	true	},
		{ "linear_mipmap_linear",	GL_LINEAR_MIPMAP_LINEAR,	true	}
	};

	tcu::Mat3 minTransform	= tcu::translationMatrix(tcu::Vec2(-0.3f, -0.6f)) * tcu::Mat3(tcu::Vec3(1.7f, 2.3f, 1.0f));
	tcu::Mat3 magTransform	= tcu::translationMatrix(tcu::Vec2( 0.3f,  0.4f)) * tcu::Mat3(tcu::Vec3(0.3f, 0.2f, 1.0f));

	for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(cases); caseNdx++)
	{
		for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(texFormats); formatNdx++)
		{
			deUint32	format		= texFormats[formatNdx].format;
			deUint32	dataType	= texFormats[formatNdx].dataType;
			deUint32	minFilter	= cases[caseNdx].filter;
			deUint32	magFilter	= (minFilter == GL_NEAREST || minFilter == GL_LINEAR) ? minFilter : GL_LINEAR;
			deUint32	wrapS		= GL_REPEAT;
			deUint32	wrapT		= GL_REPEAT;
			int			numTextures	= 1;
			bool		minify		= cases[caseNdx].minify;
			string		name		= string(cases[caseNdx].name) + (minify ? "_minify_" : "_magnify_") + texFormats[formatNdx].name;

			addChild(new Texture2DRenderCase(m_context, name.c_str(), "", format, dataType, wrapS, wrapT, minFilter, magFilter, minify ? minTransform : magTransform, numTextures, true /* pot */));
		}
	}
}